

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderBuiltinVarTests.cpp
# Opt level: O2

IterateResult __thiscall deqp::gles3::Functional::VertexIDCase::iterate(VertexIDCase *this)

{
  float *pfVar1;
  int width;
  int height;
  TestLog *pTVar2;
  pointer pVVar3;
  RenderContext *pRVar4;
  Vec4 *positions;
  float fVar5;
  float fVar6;
  float fVar7;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  last;
  __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  last_00;
  bool bVar8;
  int iVar9;
  uint uVar10;
  int x;
  int iVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  deUint32 dVar14;
  undefined4 extraout_var;
  RenderTarget *pRVar16;
  ulong uVar17;
  long lVar18;
  int ndx;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  VertexIDCase *pVVar22;
  ScopedLogSection *this_00;
  allocator<char> local_f9;
  vector<unsigned_short,_std::allocator<unsigned_short>_> indices;
  ScopedLogSection logSection_1;
  PixelBufferAccess local_c8;
  ScopedLogSection logSection;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  Surface refImg;
  Random rnd;
  Surface testImg;
  long lVar15;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar15 = CONCAT44(extraout_var,iVar9);
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar9 = pRVar16->m_width;
  pRVar16 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar11 = pRVar16->m_height;
  width = this->m_viewportW;
  height = this->m_viewportH;
  uVar10 = ((uint)this->m_iterNdx >> 0x10 ^ this->m_iterNdx ^ 0x3d) * 9;
  uVar10 = (uVar10 >> 4 ^ uVar10) * 0x27d4eb2d;
  deRandom_init(&rnd.m_rnd,uVar10 >> 0xf ^ uVar10 ^ 0xcf23ab1);
  tcu::Surface::Surface(&refImg,width,height);
  tcu::Surface::Surface(&testImg,width,height);
  x = de::Random::getInt(&rnd,0,iVar9 - width);
  iVar11 = de::Random::getInt(&rnd,0,iVar11 - height);
  uVar12 = (**(code **)(lVar15 + 0x780))((this->m_program->m_program).m_program,"a_position");
  uVar13 = (**(code **)(lVar15 + 0xb48))((this->m_program->m_program).m_program,"u_colors[0]");
  local_88._M_allocated_capacity._0_4_ = 0;
  local_88._M_allocated_capacity._4_4_ = 0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0x3f800000;
  (**(code **)(lVar15 + 0x1a00))(x,iVar11,width,height);
  (**(code **)(lVar15 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar15 + 0x40))(0x8892,this->m_positionBuffer);
  (**(code **)(lVar15 + 0x610))(uVar12);
  (**(code **)(lVar15 + 0x19f0))(uVar12,4,0x1406,0,0,0);
  (**(code **)(lVar15 + 0x15a8))
            (uVar13,(ulong)((long)(this->m_colors).
                                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->m_colors).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
  (**(code **)(lVar15 + 0x1c0))
            (local_88._M_allocated_capacity._0_4_,local_88._M_allocated_capacity._4_4_,
             local_88._8_4_,local_88._12_4_);
  (**(code **)(lVar15 + 0x188))(0x4000);
  tcu::Surface::getAccess(&local_c8,&refImg);
  tcu::clear(&local_c8,(Vec4 *)&local_88);
  iVar9 = this->m_iterNdx;
  if (iVar9 == 2) {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Iter2",(allocator<char> *)&logSection);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&indices,"glDrawElements(), indices in buffer",&local_f9);
    tcu::ScopedLogSection::ScopedLogSection
              (&logSection_1,pTVar2,(string *)&local_c8,(string *)&indices);
    std::__cxx11::string::~string((string *)&indices);
    std::__cxx11::string::~string((string *)&local_c8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&indices,(long)(this->m_positions).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_positions).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4,
               (allocator_type *)&local_c8);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)&logSection
               ,(long)(this->m_positions).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->m_positions).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_c8);
    last_00._M_current._4_4_ =
         indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
         super__Vector_impl_data._M_finish._4_4_;
    last_00._M_current._0_4_ =
         (int)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar19 = (ulong)((long)last_00._M_current -
                    (long)indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 1;
    uVar21 = 0;
    uVar17 = uVar19 & 0xffffffff;
    if ((int)uVar19 < 1) {
      uVar17 = uVar21;
    }
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[uVar21] = (unsigned_short)uVar21;
    }
    de::Random::
    shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
              (&rnd,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                     )indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,last_00);
    lVar18 = 0;
    for (lVar20 = 0;
        lVar20 < (int)((ulong)(CONCAT44(indices.
                                        super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                        ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                        (int)indices.
                                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                             ._M_impl.super__Vector_impl_data._M_finish) -
                              (long)indices.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 1);
        lVar20 = lVar20 + 1) {
      pfVar1 = ((this->m_positions).
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 * 2;
      fVar5 = pfVar1[1];
      fVar6 = pfVar1[2];
      fVar7 = pfVar1[3];
      pTVar2 = logSection.m_log +
               (ulong)*(ushort *)
                       ((long)indices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start + lVar18) * 2;
      *(float *)&pTVar2->m_log = *pfVar1;
      *(float *)((long)&pTVar2->m_log + 4) = fVar5;
      *(float *)&pTVar2[1].m_log = fVar6;
      *(float *)((long)&pTVar2[1].m_log + 4) = fVar7;
      lVar18 = lVar18 + 2;
    }
    (**(code **)(lVar15 + 0x40))(0x8893,this->m_elementBuffer);
    (**(code **)(lVar15 + 0x150))
              (0x8893,(long)((int)indices.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (int)indices.
                                 super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                 ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffffe,
               indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
               super__Vector_impl_data._M_start,0x88e8);
    (**(code **)(lVar15 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_positions).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                            *(int *)&(this->m_positions).
                                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start) & 0xfffffffffffffff0
               ,logSection.m_log,0x88e8);
    (**(code **)(lVar15 + 0x568))
              (4,(ulong)(CONCAT44(indices.
                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                  ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  (int)indices.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_finish) -
                        (long)indices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start) >> 1,0x1403,0);
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess(&local_c8,&testImg);
    glu::readPixels(pRVar4,x,iVar11,&local_c8);
    dVar14 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar14,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x423);
    tcu::Surface::getAccess(&local_c8,&refImg);
    tcu::clear(&local_c8,(Vec4 *)&local_88);
    pVVar22 = (VertexIDCase *)&local_c8;
    tcu::Surface::getAccess((PixelBufferAccess *)pVVar22,&refImg);
    renderReference(pVVar22,&local_c8,
                    (int)((ulong)(CONCAT44(indices.
                                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                           (int)indices.
                                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                ._M_impl.super__Vector_impl_data._M_finish) -
                                 (long)indices.
                                       super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 1),
                    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,(Vec4 *)logSection.m_log,
                    (this->m_colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
LAB_004e4c42:
    std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
              ((_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
               &logSection);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    this_00 = &logSection_1;
  }
  else {
    if (iVar9 == 1) {
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"Iter1",(allocator<char> *)&logSection);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&indices,"glDrawElements(), indices in client-side array",&local_f9);
      tcu::ScopedLogSection::ScopedLogSection
                (&logSection_1,pTVar2,(string *)&local_c8,(string *)&indices);
      std::__cxx11::string::~string((string *)&indices);
      std::__cxx11::string::~string((string *)&local_c8);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
                (&indices,(long)(this->m_positions).
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_positions).
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4,
                 (allocator_type *)&local_c8);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                 &logSection,
                 (long)(this->m_positions).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_positions).
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4,(allocator_type *)&local_c8);
      last._M_current._4_4_ =
           indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
           super__Vector_impl_data._M_finish._4_4_;
      last._M_current._0_4_ =
           (int)indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                super__Vector_impl_data._M_finish;
      uVar19 = (ulong)((long)last._M_current -
                      (long)indices.
                            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                            _M_impl.super__Vector_impl_data._M_start) >> 1;
      uVar21 = 0;
      uVar17 = uVar19 & 0xffffffff;
      if ((int)uVar19 < 1) {
        uVar17 = uVar21;
      }
      for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
        indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_start[uVar21] = (unsigned_short)uVar21;
      }
      de::Random::
      shuffle<__gnu_cxx::__normal_iterator<unsigned_short*,std::vector<unsigned_short,std::allocator<unsigned_short>>>>
                (&rnd,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                       )indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                        _M_impl.super__Vector_impl_data._M_start,last);
      lVar18 = 0;
      for (lVar20 = 0;
          lVar20 < (int)((ulong)(CONCAT44(indices.
                                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                          ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                          (int)indices.
                                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                               ._M_impl.super__Vector_impl_data._M_finish) -
                                (long)indices.
                                      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 1);
          lVar20 = lVar20 + 1) {
        pfVar1 = ((this->m_positions).
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18 * 2;
        fVar5 = pfVar1[1];
        fVar6 = pfVar1[2];
        fVar7 = pfVar1[3];
        pTVar2 = logSection.m_log +
                 (ulong)*(ushort *)
                         ((long)indices.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar18) * 2;
        *(float *)&pTVar2->m_log = *pfVar1;
        *(float *)((long)&pTVar2->m_log + 4) = fVar5;
        *(float *)&pTVar2[1].m_log = fVar6;
        *(float *)((long)&pTVar2[1].m_log + 4) = fVar7;
        lVar18 = lVar18 + 2;
      }
      (**(code **)(lVar15 + 0x150))
                (0x8892,(long)(*(int *)&(this->m_positions).
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                              *(int *)&(this->m_positions).
                                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) &
                        0xfffffffffffffff0,logSection.m_log,0x88e8);
      (**(code **)(lVar15 + 0x568))
                (4,(ulong)(CONCAT44(indices.
                                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                    ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                    (int)indices.
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_finish) -
                          (long)indices.
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 1,0x1403);
      pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
      tcu::Surface::getAccess(&local_c8,&testImg);
      glu::readPixels(pRVar4,x,iVar11,&local_c8);
      dVar14 = (**(code **)(lVar15 + 0x800))();
      glu::checkError(dVar14,"Draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                      ,0x409);
      pVVar22 = (VertexIDCase *)&local_c8;
      tcu::Surface::getAccess((PixelBufferAccess *)pVVar22,&refImg);
      renderReference(pVVar22,&local_c8,
                      (int)((ulong)(CONCAT44(indices.
                                             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                                             (int)indices.
                                                  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish) -
                                   (long)indices.
                                         super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 1),
                      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                      _M_impl.super__Vector_impl_data._M_start,(Vec4 *)logSection.m_log,
                      (this->m_colors).
                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      goto LAB_004e4c42;
    }
    if (iVar9 != 0) goto LAB_004e4cae;
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"Iter0",(allocator<char> *)&logSection_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&indices,"glDrawArrays()",&local_f9);
    tcu::ScopedLogSection::ScopedLogSection
              (&logSection,pTVar2,(string *)&local_c8,(string *)&indices);
    std::__cxx11::string::~string((string *)&indices);
    std::__cxx11::string::~string((string *)&local_c8);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
              (&indices,(long)(this->m_positions).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_positions).
                              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4,
               (allocator_type *)&local_c8);
    pVVar3 = (this->m_positions).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    (**(code **)(lVar15 + 0x150))
              (0x8892,(long)(*(int *)&(this->m_positions).
                                      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (int)pVVar3) &
                      0xfffffffffffffff0,pVVar3,0x88e8);
    (**(code **)(lVar15 + 0x538))
              (4,0,(ulong)((long)(this->m_positions).
                                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_positions).
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4);
    pRVar4 = ((this->super_TestCase).m_context)->m_renderCtx;
    tcu::Surface::getAccess(&local_c8,&testImg);
    glu::readPixels(pRVar4,x,iVar11,&local_c8);
    dVar14 = (**(code **)(lVar15 + 0x800))();
    glu::checkError(dVar14,"Draw",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderBuiltinVarTests.cpp"
                    ,0x3ee);
    uVar19 = (ulong)(CONCAT44(indices.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_finish._4_4_,
                              (int)indices.
                                   super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                                   ._M_impl.super__Vector_impl_data._M_finish) -
                    (long)indices.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 1;
    uVar21 = 0;
    uVar17 = uVar19 & 0xffffffff;
    if ((int)uVar19 < 1) {
      uVar17 = uVar21;
    }
    for (; uVar17 != uVar21; uVar21 = uVar21 + 1) {
      indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start[uVar21] = (unsigned_short)uVar21;
    }
    pVVar22 = (VertexIDCase *)&local_c8;
    tcu::Surface::getAccess((PixelBufferAccess *)pVVar22,&refImg);
    positions = (this->m_positions).
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
    renderReference(pVVar22,&local_c8,
                    (int)((ulong)((long)(this->m_positions).
                                        super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)positions
                                 ) >> 4),
                    indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                    _M_impl.super__Vector_impl_data._M_start,positions,
                    (this->m_colors).
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
              (&indices.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>);
    this_00 = &logSection;
  }
  tcu::ScopedLogSection::~ScopedLogSection(this_00);
LAB_004e4cae:
  bVar8 = tcu::fuzzyCompare(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                            "Result","Image comparison result",&refImg,&testImg,0.02,
                            COMPARE_LOG_RESULT);
  if (!bVar8) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  iVar9 = this->m_iterNdx + 1;
  this->m_iterNdx = iVar9;
  tcu::Surface::~Surface(&testImg);
  tcu::Surface::~Surface(&refImg);
  return (IterateResult)(iVar9 < 3);
}

Assistant:

VertexIDCase::IterateResult VertexIDCase::iterate (void)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				width		= m_context.getRenderTarget().getWidth();
	const int				height		= m_context.getRenderTarget().getHeight();
	const int				viewportW	= m_viewportW;
	const int				viewportH	= m_viewportH;

	const float				threshold	= 0.02f;

	de::Random				rnd			(0xcf23ab1 ^ deInt32Hash(m_iterNdx));
	tcu::Surface			refImg		(viewportW, viewportH);
	tcu::Surface			testImg		(viewportW, viewportH);

	const int				viewportX	= rnd.getInt(0, width-viewportW);
	const int				viewportY	= rnd.getInt(0, height-viewportH);

	const int				posLoc		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const int				colorsLoc	= gl.getUniformLocation(m_program->getProgram(), "u_colors[0]");
	const tcu::Vec4			clearColor	(0.0f, 0.0f, 0.0f, 1.0f);

	// Setup common state.
	gl.viewport					(viewportX, viewportY, viewportW, viewportH);
	gl.useProgram				(m_program->getProgram());
	gl.bindBuffer				(GL_ARRAY_BUFFER, m_positionBuffer);
	gl.enableVertexAttribArray	(posLoc);
	gl.vertexAttribPointer		(posLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	gl.uniform4fv				(colorsLoc, (int)m_colors.size(), (const float*)&m_colors[0]);

	// Clear render target to black.
	gl.clearColor	(clearColor.x(), clearColor.y(), clearColor.z(), clearColor.w());
	gl.clear		(GL_COLOR_BUFFER_BIT);

	tcu::clear(refImg.getAccess(), clearColor);

	if (m_iterNdx == 0)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter0", "glDrawArrays()");
		vector<deUint16>		indices		(m_positions.size());

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &m_positions[0], GL_DYNAMIC_DRAW);
		gl.drawArrays(GL_TRIANGLES, 0, (int)m_positions.size());

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		// Reference indices
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;

		renderReference(refImg.getAccess(), (int)m_positions.size(), &indices[0], &m_positions[0], &m_colors[0]);
	}
	else if (m_iterNdx == 1)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter1", "glDrawElements(), indices in client-side array");
		vector<deUint16>		indices		(m_positions.size());
		vector<tcu::Vec4>		mappedPos	(m_positions.size());

		// Compute initial indices and suffle
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;
		rnd.shuffle(indices.begin(), indices.end());

		// Use indices to re-map positions.
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			mappedPos[indices[ndx]] = m_positions[ndx];

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &mappedPos[0], GL_DYNAMIC_DRAW);
		gl.drawElements(GL_TRIANGLES, (int)indices.size(), GL_UNSIGNED_SHORT, &indices[0]);

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		renderReference(refImg.getAccess(), (int)indices.size(), &indices[0], &mappedPos[0], &m_colors[0]);
	}
	else if (m_iterNdx == 2)
	{
		tcu::ScopedLogSection	logSection	(m_testCtx.getLog(), "Iter2", "glDrawElements(), indices in buffer");
		vector<deUint16>		indices		(m_positions.size());
		vector<tcu::Vec4>		mappedPos	(m_positions.size());

		// Compute initial indices and suffle
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			indices[ndx] = (deUint16)ndx;
		rnd.shuffle(indices.begin(), indices.end());

		// Use indices to re-map positions.
		for (int ndx = 0; ndx < (int)indices.size(); ndx++)
			mappedPos[indices[ndx]] = m_positions[ndx];

		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_elementBuffer);
		gl.bufferData(GL_ELEMENT_ARRAY_BUFFER, (int)(indices.size()*sizeof(deUint16)), &indices[0], GL_DYNAMIC_DRAW);

		gl.bufferData(GL_ARRAY_BUFFER, (int)(m_positions.size()*sizeof(tcu::Vec4)), &mappedPos[0], GL_DYNAMIC_DRAW);
		gl.drawElements(GL_TRIANGLES, (int)indices.size(), GL_UNSIGNED_SHORT, DE_NULL);

		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, testImg.getAccess());
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw");

		tcu::clear(refImg.getAccess(), clearColor);
		renderReference(refImg.getAccess(), (int)indices.size(), &indices[0], &mappedPos[0], &m_colors[0]);
	}
	else
		DE_ASSERT(false);

	if (!tcu::fuzzyCompare(m_testCtx.getLog(), "Result", "Image comparison result", refImg, testImg, threshold, tcu::COMPARE_LOG_RESULT))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_iterNdx += 1;
	return (m_iterNdx < 3) ? CONTINUE : STOP;
}